

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateLookUpInIndexCache
          (Lowerer *this,Instr *instrInsert,RegOpnd *indexOpnd,RegOpnd *baseOpnd,
          RegOpnd *opndSlotArray,RegOpnd *opndSlotIndex,uint32 inlineCacheOffset,
          uint32 hitRateOffset,LabelInstr *labelHelper,FldInfoFlags flags)

{
  code *pcVar1;
  LabelInstr *instr;
  Instr *insertBeforeInstr;
  BranchInstr *branchRef;
  bool bVar2;
  RegOpnd *dst;
  IndirOpnd *pIVar3;
  RegOpnd *inlineCacheOpnd;
  undefined4 *puVar4;
  Type *ppBVar5;
  IntConstOpnd *src2;
  RegOpnd *local_78;
  RegOpnd *taggedTypeOpnd;
  RegOpnd *local_68;
  LabelInstr *local_60;
  Instr *local_58;
  RegOpnd *local_50;
  BranchInstr *local_48;
  BranchInstr *branchToPatch;
  LabelInstr *nextLabel;
  
  nextLabel._6_1_ = flags != FldInfo_NoInfo;
  nextLabel._7_1_ = (~flags & 0x21) != 0;
  nextLabel._5_1_ = (~flags & 0x41) == 0 || flags == FldInfo_NoInfo;
  local_58 = instrInsert;
  local_50 = opndSlotArray;
  LowererMD::GenerateObjectTest
            (&this->m_lowererMD,&baseOpnd->super_Opnd,instrInsert,labelHelper,false);
  dst = IR::RegOpnd::New(TyUint64,this->m_func);
  taggedTypeOpnd = baseOpnd;
  pIVar3 = IR::IndirOpnd::New(baseOpnd,8,TyUint64,this->m_func,false);
  InsertMove(&dst->super_Opnd,&pIVar3->super_Opnd,instrInsert,true);
  inlineCacheOpnd = IR::RegOpnd::New(TyUint64,this->m_func);
  pIVar3 = IR::IndirOpnd::New(indexOpnd,inlineCacheOffset,TyUint64,this->m_func,false);
  InsertMove(&inlineCacheOpnd->super_Opnd,&pIVar3->super_Opnd,instrInsert,true);
  local_68 = dst;
  GenerateDynamicLoadPolymorphicInlineCacheSlot(this,instrInsert,inlineCacheOpnd,&dst->super_Opnd);
  local_60 = IR::LabelInstr::New(Label,this->m_func,false);
  local_48 = (Type)0x0;
  branchToPatch = (BranchInstr *)0x0;
  local_78 = (RegOpnd *)0x0;
  if ((nextLabel._6_1_ & nextLabel._7_1_) == 0) {
    GenerateLookUpInIndexCacheHelper<true,true,false>
              (this,local_58,taggedTypeOpnd,local_50,opndSlotIndex,local_68,inlineCacheOpnd,local_60
               ,labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_78);
  }
  if (nextLabel._5_1_ != '\0') {
    GenerateLookUpInIndexCacheHelper<true,false,false>
              (this,local_58,taggedTypeOpnd,local_50,opndSlotIndex,local_68,inlineCacheOpnd,local_60
               ,labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_78);
  }
  if ((flags & FldInfo_FromProto) != FldInfo_NoInfo) {
    if ((flags & FldInfo_FromInlineSlots) != FldInfo_NoInfo) {
      GenerateLookUpInIndexCacheHelper<false,true,false>
                (this,local_58,taggedTypeOpnd,local_50,opndSlotIndex,local_68,inlineCacheOpnd,
                 local_60,labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_78);
    }
    if ((flags & FldInfo_FromAuxSlots) != FldInfo_NoInfo) {
      GenerateLookUpInIndexCacheHelper<false,false,false>
                (this,local_58,taggedTypeOpnd,local_50,opndSlotIndex,local_68,inlineCacheOpnd,
                 local_60,labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_78);
    }
  }
  if ((flags & FldInfo_FromLocalWithoutProperty) != FldInfo_NoInfo) {
    if (local_50 == (RegOpnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x414e,"(opndSlotArray)","opndSlotArray");
      if (!bVar2) goto LAB_005e96ed;
      *puVar4 = 0;
    }
    if ((flags & FldInfo_FromInlineSlots) != FldInfo_NoInfo) {
      GenerateLookUpInIndexCacheHelper<true,true,true>
                (this,local_58,taggedTypeOpnd,local_50,opndSlotIndex,local_68,inlineCacheOpnd,
                 local_60,labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_78);
    }
    if ((flags & FldInfo_FromAuxSlots) != FldInfo_NoInfo) {
      GenerateLookUpInIndexCacheHelper<true,false,true>
                (this,local_58,taggedTypeOpnd,local_50,opndSlotIndex,local_68,inlineCacheOpnd,
                 local_60,labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_78);
    }
  }
  if (local_48 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x416f,"(branchToPatch)","branchToPatch");
    if (!bVar2) goto LAB_005e96ed;
    *puVar4 = 0;
  }
  if (branchToPatch == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4170,"(nextLabel)","nextLabel");
    if (!bVar2) goto LAB_005e96ed;
    *puVar4 = 0;
  }
  if (*(int *)&branchToPatch->m_regContent == 1) {
    ppBVar5 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                        ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                         &branchToPatch->field_0x58);
    if (*ppBVar5 != local_48) goto LAB_005e959f;
  }
  else {
LAB_005e959f:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4171,
                       "(nextLabel->labelRefs.Count() == 1 && nextLabel->labelRefs.Head() == branchToPatch)"
                       ,
                       "nextLabel->labelRefs.Count() == 1 && nextLabel->labelRefs.Head() == branchToPatch"
                      );
    if (!bVar2) goto LAB_005e96ed;
    *puVar4 = 0;
  }
  branchRef = local_48;
  instr = local_60;
  if (local_48->m_isMultiBranch == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
    if (!bVar2) {
LAB_005e96ed:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (branchRef->m_branchTarget != (LabelInstr *)0x0) {
    IR::LabelInstr::RemoveLabelRef(branchRef->m_branchTarget,branchRef);
  }
  if (labelHelper != (LabelInstr *)0x0) {
    IR::LabelInstr::AddLabelRef(labelHelper,branchRef);
  }
  branchRef->m_branchTarget = labelHelper;
  IR::Instr::Remove(&branchToPatch->super_Instr);
  insertBeforeInstr = local_58;
  IR::Instr::InsertBefore(local_58,&instr->super_Instr);
  pIVar3 = IR::IndirOpnd::New(indexOpnd,hitRateOffset,TyInt32,this->m_func,false);
  src2 = IR::IntConstOpnd::New(1,TyInt32,this->m_func,false);
  InsertAdd(false,&pIVar3->super_Opnd,&pIVar3->super_Opnd,&src2->super_Opnd,insertBeforeInstr);
  return;
}

Assistant:

void
Lowerer::GenerateLookUpInIndexCache(
    _In_ IR::Instr* instrInsert,
    _In_ IR::RegOpnd* indexOpnd,
    _In_ IR::RegOpnd* baseOpnd,
    _In_opt_ IR::RegOpnd* opndSlotArray,
    _In_opt_ IR::RegOpnd* opndSlotIndex,
    _In_ const uint32 inlineCacheOffset,
    _In_ const uint32 hitRateOffset,
    _In_ IR::LabelInstr* labelHelper,
    _In_ Js::FldInfoFlags flags) // = Js::FldInfo_NoInfo
{
    // Generates:
    //      MOV inlineCacheOpnd, index->inlineCache
    //      GenerateObjectTest(baseOpnd, $helper)         ; verify base is an object
    //      MOV objectTypeOpnd, baseOpnd->type
    //      GenerateDynamicLoadPolymorphicInlineCacheSlot(inlineCacheOpnd, objectTypeOpnd) ; loads inline cache for given type
    // if (checkLocalInlineSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckInlineSlot> // checks local inline slots, goes to next on failure
    // if (checkLocalAuxSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckAuxSlot> // checks local aux slots, goes to next on failure
    // if (fromProto && fromInlineSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckProto, CheckInlineSlot> // checks proto inline slots, goes to next on failure
    // if (fromProto && fromAuxSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckProto, CheckAuxSlot> // checks proto aux slots, goes to next on failure
    // if (doAdd && fromInlineSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckInlineSlot, DoAdd> // checks typeWithoutProperty inline slots, goes to next on failure
    // if (doAdd && fromAuxSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckAuxSlot, DoAdd> // checks typeWithoutProperty aux slots, goes to helper on failure
    // $slotIndexLoadedLabel
    //      INC indexOpnd->hitRate

    const bool fromInlineSlots = (flags & Js::FldInfo_FromInlineSlots) == Js::FldInfo_FromInlineSlots;
    const bool fromAuxSlots = (flags & Js::FldInfo_FromAuxSlots) == Js::FldInfo_FromAuxSlots;
    const bool fromLocal = (flags & Js::FldInfo_FromLocal) == Js::FldInfo_FromLocal;
    const bool fromProto = (flags & Js::FldInfo_FromProto) == Js::FldInfo_FromProto;
    const bool doAdd = (flags & Js::FldInfo_FromLocalWithoutProperty) == Js::FldInfo_FromLocalWithoutProperty;

    const bool checkLocalInlineSlots = flags == Js::FldInfo_NoInfo || (fromInlineSlots && fromLocal);
    const bool checkLocalAuxSlots = flags == Js::FldInfo_NoInfo || (fromAuxSlots && fromLocal);

    m_lowererMD.GenerateObjectTest(baseOpnd, instrInsert, labelHelper);

    IR::RegOpnd * objectTypeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(objectTypeOpnd, IR::IndirOpnd::New(baseOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, m_func), instrInsert);

    IR::RegOpnd * inlineCacheOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(inlineCacheOpnd, IR::IndirOpnd::New(indexOpnd, inlineCacheOffset, TyMachPtr, m_func), instrInsert);

    GenerateDynamicLoadPolymorphicInlineCacheSlot(instrInsert, inlineCacheOpnd, objectTypeOpnd);

    IR::LabelInstr* slotIndexLoadedLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    IR::BranchInstr* branchToPatch = nullptr;
    IR::LabelInstr* nextLabel = nullptr;
    IR::RegOpnd* taggedTypeOpnd = nullptr;
    if (checkLocalInlineSlots)
    {
        GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, true /* CheckInlineSlot */, false /* DoAdd */>(
            instrInsert,
            baseOpnd,
            opndSlotArray,
            opndSlotIndex,
            objectTypeOpnd,
            inlineCacheOpnd,
            slotIndexLoadedLabel,
            labelHelper,
            &nextLabel,
            &branchToPatch,
            &taggedTypeOpnd);
    }
    if (checkLocalAuxSlots)
    {
        GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, false /* CheckInlineSlot */, false /* DoAdd */>(
            instrInsert,
            baseOpnd,
            opndSlotArray,
            opndSlotIndex,
            objectTypeOpnd,
            inlineCacheOpnd,
            slotIndexLoadedLabel,
            labelHelper,
            &nextLabel,
            &branchToPatch,
            &taggedTypeOpnd);
    }

    if (fromProto)
    {
        if (fromInlineSlots)
        {
            GenerateLookUpInIndexCacheHelper<false /* CheckLocal */, true /* CheckInlineSlot */, false /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
        if (fromAuxSlots)
        {
            GenerateLookUpInIndexCacheHelper<false /* CheckLocal */, false /* CheckInlineSlot */, false /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
    }
    if (doAdd)
    {
        Assert(opndSlotArray);

        if (fromInlineSlots)
        {
            GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, true /* CheckInlineSlot */, true /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
        if (fromAuxSlots)
        {
            GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, false /* CheckInlineSlot */, true /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
    }
    Assert(branchToPatch);
    Assert(nextLabel);
    Assert(nextLabel->labelRefs.Count() == 1 && nextLabel->labelRefs.Head() == branchToPatch);

    branchToPatch->SetTarget(labelHelper);
    nextLabel->Remove();

    instrInsert->InsertBefore(slotIndexLoadedLabel);

    IR::IndirOpnd * hitRateOpnd = IR::IndirOpnd::New(indexOpnd, hitRateOffset, TyInt32, m_func);
    IR::IntConstOpnd * incOpnd = IR::IntConstOpnd::New(1, TyInt32, m_func);
    // overflow check: not needed here, we don't allocate anything with hitrate
    InsertAdd(false, hitRateOpnd, hitRateOpnd, incOpnd, instrInsert);
}